

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,
                   SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  anon_union_4_5_a3ff96c3_for_Inst_2 aVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *this_01;
  bool bVar2;
  InstOp IVar3;
  int i;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  ostream *poVar7;
  ostream *this_02;
  size_type sVar8;
  int local_1d8 [4];
  LogMessage local_1c8;
  Inst *local_48;
  Inst *ip;
  vector<int,_std::allocator<int>_> *pvStack_38;
  int id;
  vector<int,_std::allocator<int>_> *stk_local;
  SparseSet *reachable_local;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat_local;
  SparseArray<int> *rootmap_local;
  Prog *pPStack_10;
  int root_local;
  Prog *this_local;
  
  pvStack_38 = stk;
  stk_local = (vector<int,_std::allocator<int>_> *)reachable;
  reachable_local = (SparseSet *)flat;
  flat_local = (vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)rootmap;
  rootmap_local._4_4_ = root;
  pPStack_10 = this;
  SparseSetT<void>::clear(reachable);
  std::vector<int,_std::allocator<int>_>::clear(pvStack_38);
  std::vector<int,_std::allocator<int>_>::push_back
            (pvStack_38,(value_type_conflict *)((long)&rootmap_local + 4));
LAB_00384a3c:
  do {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(pvStack_38);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::back(pvStack_38);
    ip._4_4_ = *pvVar4;
    std::vector<int,_std::allocator<int>_>::pop_back(pvStack_38);
    while (bVar2 = SparseSetT<void>::contains((SparseSetT<void> *)stk_local,ip._4_4_), !bVar2) {
      SparseSetT<void>::insert_new((SparseSetT<void> *)stk_local,ip._4_4_);
      if ((ip._4_4_ != rootmap_local._4_4_) &&
         (bVar2 = SparseArray<int>::has_index((SparseArray<int> *)flat_local,ip._4_4_), bVar2)) {
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)reachable_local);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        Inst::set_opcode(pvVar5,kInstNop);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        piVar6 = SparseArray<int>::get_existing((SparseArray<int> *)flat_local,ip._4_4_);
        Inst::set_out(pvVar5,*piVar6);
        break;
      }
      local_48 = inst(this,ip._4_4_);
      IVar3 = Inst::opcode(local_48);
      switch(IVar3) {
      case kInstAltMatch:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)reachable_local);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        Inst::set_opcode(pvVar5,kInstAltMatch);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        sVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                          ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                           reachable_local);
        Inst::set_out(pvVar5,(int)sVar8);
        sVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                          ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                           reachable_local);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        (pvVar5->field_1).out1_ = (int)sVar8 + 1;
      case kInstAlt:
        this_00 = pvStack_38;
        local_1d8[0] = Inst::out1(local_48);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,local_1d8);
        ip._4_4_ = Inst::out(local_48);
        break;
      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)reachable_local);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        aVar1 = local_48->field_1;
        pvVar5->out_opcode_ = local_48->out_opcode_;
        pvVar5->field_1 = aVar1;
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        this_01 = flat_local;
        i = Inst::out(local_48);
        piVar6 = SparseArray<int>::get_existing((SparseArray<int> *)this_01,i);
        Inst::set_out(pvVar5,*piVar6);
        goto LAB_00384a3c;
      case kInstMatch:
      case kInstFail:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)reachable_local);
        pvVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            reachable_local);
        aVar1 = local_48->field_1;
        pvVar5->out_opcode_ = local_48->out_opcode_;
        pvVar5->field_1 = aVar1;
        goto LAB_00384a3c;
      case kInstNop:
        ip._4_4_ = Inst::out(local_48);
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/prog.cc"
                   ,0x328);
        poVar7 = LogMessage::stream(&local_1c8);
        this_02 = std::operator<<((ostream *)poVar7,"unhandled opcode: ");
        IVar3 = Inst::opcode(local_48);
        std::ostream::operator<<(this_02,IVar3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
      }
    }
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}